

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O0

void log_event(int event,void *ptr,size_t size)

{
  pid_t pVar1;
  map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
  *this;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  mapped_type *__dest;
  reference __x;
  FILE *__stream;
  pointer ppVar5;
  __enable_if_t<is_constructible<value_type,_pair<void_*const,_hu_allocinfo_s>_&>::value,_pair<iterator,_bool>_>
  _Var6;
  FILE *f;
  int callstack_depth;
  void *callstack [20];
  _Self local_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  undefined1 local_198;
  _Self local_190;
  _Self local_188;
  iterator allocation;
  hu_allocinfo_t allocinfo;
  size_t size_local;
  void *ptr_local;
  int event_local;
  
  if (logging_enabled != 0) {
    allocinfo._344_8_ = size;
    size_local = (size_t)ptr;
    ptr_local._4_4_ = event;
    if (event == 1) {
      if (hu_log_free != 0) {
        std::
        map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
        ::erase(freed_allocations,(key_type *)&size_local);
      }
      if (hu_log_minleak <= (ulong)allocinfo._344_8_) {
        allocinfo.ptr = (void *)allocinfo._344_8_;
        allocation._M_node = (_Base_ptr)size_local;
        allocinfo.callstack[0x13]._0_4_ = backtrace(&allocinfo.size,0x14);
        allocinfo.free_callstack[0x13]._4_4_ = 1;
        __dest = std::
                 map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                 ::operator[](allocations,(key_type *)&size_local);
        memcpy(__dest,&allocation,0x160);
        allocinfo_total_allocs = allocinfo_total_allocs + 1;
        allocinfo_total_alloc_bytes = allocinfo._344_8_ + allocinfo_total_alloc_bytes;
        allocinfo_current_alloc_bytes = allocinfo._344_8_ + allocinfo_current_alloc_bytes;
        if (allocinfo_peak_alloc_bytes < allocinfo_current_alloc_bytes) {
          allocinfo_peak_alloc_bytes = allocinfo_current_alloc_bytes;
        }
      }
    }
    else if (event == 2) {
      local_188._M_node =
           (_Base_ptr)
           std::
           map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
           ::find(allocations,(key_type *)&size_local);
      local_190._M_node =
           (_Base_ptr)
           std::
           map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
           ::end(allocations);
      bVar3 = std::operator!=(&local_188,&local_190);
      if (bVar3) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                           (&local_188);
        allocinfo_current_alloc_bytes = allocinfo_current_alloc_bytes - (ppVar5->second).size;
        if (((hu_useafterfree & 1U) != 0) || (hu_log_free != 0)) {
          ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                             (&local_188);
          iVar4 = backtrace((ppVar5->second).free_callstack,0x14);
          ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                             (&local_188);
          (ppVar5->second).free_callstack_depth = iVar4;
          this = freed_allocations;
          __x = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator*
                          (&local_188);
          _Var6 = std::
                  map<void*,hu_allocinfo_s,std::less<void*>,std::allocator<std::pair<void*const,hu_allocinfo_s>>>
                  ::insert<std::pair<void*const,hu_allocinfo_s>&>
                            ((map<void*,hu_allocinfo_s,std::less<void*>,std::allocator<std::pair<void*const,hu_allocinfo_s>>>
                              *)this,__x);
          local_1a0 = (_Base_ptr)_Var6.first._M_node;
          local_198 = _Var6.second;
        }
        std::
        map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
        ::erase(allocations,(key_type *)&size_local);
      }
      else if (hu_log_free != 0) {
        local_1a8 = (_Base_ptr)
                    std::
                    map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                    ::find(freed_allocations,(key_type *)&size_local);
        local_188._M_node = local_1a8;
        local_1b0._M_node =
             (_Base_ptr)
             std::
             map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
             ::end(freed_allocations);
        bVar3 = std::operator!=(&local_188,&local_1b0);
        if (bVar3) {
          iVar4 = backtrace(&stack0xfffffffffffffda8,0x14);
          bVar3 = log_is_valid_callstack(iVar4,(void **)&stack0xfffffffffffffda8,false);
          if ((bVar3) && (__stream = fopen(hu_log_file,"a"), __stream != (FILE *)0x0)) {
            fprintf(__stream,"==%d== Invalid deallocation at:\n",(ulong)(uint)pid);
            log_print_callstack((FILE *)__stream,iVar4,(void **)&stack0xfffffffffffffda8);
            sVar2 = size_local;
            pVar1 = pid;
            ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                               (&local_188);
            fprintf(__stream,"==%d==  Address %p is a block of size %ld free\'d at:\n",
                    (ulong)(uint)pVar1,sVar2,(ppVar5->second).size);
            ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                               (&local_188);
            iVar4 = (ppVar5->second).free_callstack_depth;
            ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                               (&local_188);
            log_print_callstack((FILE *)__stream,iVar4,(ppVar5->second).free_callstack);
            fprintf(__stream,"==%d==  Block was alloc\'d at:\n",(ulong)(uint)pid);
            ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                               (&local_188);
            iVar4 = (ppVar5->second).callstack_depth;
            ppVar5 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                               (&local_188);
            log_print_callstack((FILE *)__stream,iVar4,(ppVar5->second).callstack);
            fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
            fclose(__stream);
          }
        }
      }
      allocinfo_total_frees = allocinfo_total_frees + 1;
    }
  }
  return;
}

Assistant:

void log_event(int event, void *ptr, size_t size)
{
  if (logging_enabled)
  {
    if (event == EVENT_MALLOC)
    {
      if (hu_log_free)
      {
        freed_allocations->erase(ptr);
      }
      
      if (size >= hu_log_minleak)
      {
        hu_allocinfo_t allocinfo;
        allocinfo.size = size;
        allocinfo.ptr = ptr;
        allocinfo.callstack_depth = backtrace(allocinfo.callstack, MAX_CALL_STACK);
        allocinfo.count = 1;
        (*allocations)[ptr] = allocinfo;
        
        allocinfo_total_allocs += 1;
        allocinfo_total_alloc_bytes += size;
        allocinfo_current_alloc_bytes += size;

        if (allocinfo_current_alloc_bytes > allocinfo_peak_alloc_bytes)
        {
          allocinfo_peak_alloc_bytes = allocinfo_current_alloc_bytes;
        }
      }
    }
      else if (event == EVENT_FREE)
      {
        std::map<void*, hu_allocinfo_t>::iterator allocation = allocations->find(ptr);
        if (allocation != allocations->end())
        {
          allocinfo_current_alloc_bytes -= allocation->second.size;

          if (hu_useafterfree || hu_log_free)
          {
            allocation->second.free_callstack_depth =
              backtrace(allocation->second.free_callstack, MAX_CALL_STACK);
            freed_allocations->insert(*allocation);
          }
          
          allocations->erase(ptr);
        }
        else if (hu_log_free)
        {
          allocation = freed_allocations->find(ptr);
          if (allocation != freed_allocations->end())
          {
            void *callstack[MAX_CALL_STACK];
            int callstack_depth = backtrace(callstack, MAX_CALL_STACK);
            if (log_is_valid_callstack(callstack_depth, callstack, false))
            {
              FILE *f = fopen(hu_log_file, "a");
              if (f)
              {
                fprintf(f, "==%d== Invalid deallocation at:\n", pid);

                log_print_callstack(f, callstack_depth, callstack);

                fprintf(f, "==%d==  Address %p is a block of size %ld free'd at:\n",
                        pid, ptr, allocation->second.size);
          
                log_print_callstack(f, allocation->second.free_callstack_depth,
                                    allocation->second.free_callstack);

                fprintf(f, "==%d==  Block was alloc'd at:\n", pid);
          
                log_print_callstack(f, allocation->second.callstack_depth,
                                    allocation->second.callstack);

                fprintf(f, "==%d== \n", pid);

                fclose(f);
              }
            }
          }
        }

        allocinfo_total_frees += 1;
      }

  }
}